

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::VerifyUtf8String
               (char *data,int size,Operation op,char *field_name)

{
  bool bVar1;
  char *pcVar2;
  char *operation_str;
  
  bVar1 = IsStructurallyValidUTF8(data,size);
  if (!bVar1) {
    pcVar2 = "serializing";
    if (op != SERIALIZE) {
      pcVar2 = (char *)0x0;
    }
    operation_str = "parsing";
    if (op != PARSE) {
      operation_str = pcVar2;
    }
    PrintUTF8ErrorLog(field_name,operation_str,false);
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::VerifyUtf8String(const char* data, int size, Operation op,
                                      const char* field_name) {
  if (!IsStructurallyValidUTF8(data, size)) {
    const char* operation_str = NULL;
    switch (op) {
      case PARSE:
        operation_str = "parsing";
        break;
      case SERIALIZE:
        operation_str = "serializing";
        break;
        // no default case: have the compiler warn if a case is not covered.
    }
    PrintUTF8ErrorLog(field_name, operation_str, false);
    return false;
  }
  return true;
}